

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::CFIReaderImpl::Vocabulary::Vocabulary(Vocabulary *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  
  memset(this,0,0x120);
  paVar1 = &local_78[0].field_2;
  local_78[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"xml","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->prefixTable
             ,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_78[0]._M_dataplus._M_p,local_78[0].field_2._M_allocated_capacity + 1);
  }
  local_78[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"http://www.w3.org/XML/1998/namespace","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->namespaceNameTable,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_78[0]._M_dataplus._M_p,local_78[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Vocabulary() {
            prefixTable.push_back("xml");
            namespaceNameTable.push_back("http://www.w3.org/XML/1998/namespace");
        }